

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O2

StorageClass __thiscall
spirv_cross::CompilerGLSL::get_expression_effective_storage_class(CompilerGLSL *this,uint32_t ptr)

{
  bool bVar1;
  int iVar2;
  SPIRVariable *pSVar3;
  SPIRExpression *pSVar4;
  size_type sVar5;
  SPIRType *pSVar6;
  StorageClass *pSVar7;
  uint32_t ptr_local;
  
  pSVar3 = Compiler::maybe_get_backing_variable(&this->super_Compiler,ptr);
  ptr_local = ptr;
  if (((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr[ptr].type ==
       TypeExpression) &&
     (pSVar4 = Compiler::get<spirv_cross::SPIRExpression>(&this->super_Compiler,ptr),
     pSVar4->access_chain == false)) {
    sVar5 = ::std::
            _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
            ::count(&(this->super_Compiler).forced_temporaries._M_h,&ptr_local);
    if (sVar5 == 0) {
      sVar5 = ::std::
              _Hashtable<unsigned_int,_unsigned_int,_std::allocator<unsigned_int>,_std::__detail::_Identity,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
              ::count(&(this->super_Compiler).forwarded_temporaries._M_h,&ptr_local);
      bVar1 = sVar5 == 0;
      goto LAB_00260d3d;
    }
  }
  else {
    bVar1 = false;
LAB_00260d3d:
    if ((pSVar3 != (SPIRVariable *)0x0) && (!bVar1)) {
      iVar2 = (*(this->super_Compiler)._vptr_Compiler[0x1c])(this,pSVar3,4);
      if ((char)iVar2 != '\0') {
        return StorageClassWorkgroup;
      }
      iVar2 = (*(this->super_Compiler)._vptr_Compiler[0x1c])(this,pSVar3,0xc);
      if ((char)iVar2 != '\0') {
        return StorageClassStorageBuffer;
      }
      if (pSVar3->storage != StorageClassUniform) {
        return pSVar3->storage;
      }
      pSVar6 = Compiler::get<spirv_cross::SPIRType>
                         (&this->super_Compiler,*(uint32_t *)&(pSVar3->super_IVariant).field_0xc);
      bVar1 = Compiler::has_decoration
                        (&this->super_Compiler,(ID)(pSVar6->super_IVariant).self.id,
                         DecorationBufferBlock);
      if (bVar1) {
        return StorageClassStorageBuffer;
      }
      pSVar7 = &pSVar3->storage;
      goto LAB_00260da6;
    }
  }
  pSVar6 = Compiler::expression_type(&this->super_Compiler,ptr_local);
  pSVar7 = &pSVar6->storage;
LAB_00260da6:
  return *pSVar7;
}

Assistant:

StorageClass CompilerGLSL::get_expression_effective_storage_class(uint32_t ptr)
{
	auto *var = maybe_get_backing_variable(ptr);

	// If the expression has been lowered to a temporary, we need to use the Generic storage class.
	// We're looking for the effective storage class of a given expression.
	// An access chain or forwarded OpLoads from such access chains
	// will generally have the storage class of the underlying variable, but if the load was not forwarded
	// we have lost any address space qualifiers.
	bool forced_temporary = ir.ids[ptr].get_type() == TypeExpression && !get<SPIRExpression>(ptr).access_chain &&
	                        (forced_temporaries.count(ptr) != 0 || forwarded_temporaries.count(ptr) == 0);

	if (var && !forced_temporary)
	{
		if (variable_decl_is_remapped_storage(*var, StorageClassWorkgroup))
			return StorageClassWorkgroup;
		if (variable_decl_is_remapped_storage(*var, StorageClassStorageBuffer))
			return StorageClassStorageBuffer;

		// Normalize SSBOs to StorageBuffer here.
		if (var->storage == StorageClassUniform &&
		    has_decoration(get<SPIRType>(var->basetype).self, DecorationBufferBlock))
			return StorageClassStorageBuffer;
		else
			return var->storage;
	}
	else
		return expression_type(ptr).storage;
}